

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

Type * __thiscall
spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(TypeManager *this,Instruction *inst)

{
  pointer *ppvVar1;
  IdToTypeMap *this_00;
  mapped_type pIVar2;
  IRContext *pIVar3;
  mapped_type pTVar4;
  pointer pOVar5;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var6;
  pointer ppIVar7;
  int32_t iVar8;
  uint32_t uVar9;
  uint32_t use;
  uint32_t uVar10;
  StorageClass sc;
  uint32_t uVar11;
  NodePayloadArrayAMDX *this_01;
  TensorViewNV *this_02;
  Function *this_03;
  Struct *this_04;
  Vector *this_05;
  Operand *this_06;
  mapped_type *ppIVar12;
  CooperativeVectorNV *this_07;
  Type *pTVar13;
  TensorLayoutNV *this_08;
  CooperativeMatrixKHR *this_09;
  CooperativeMatrixNV *this_10;
  Matrix *this_11;
  Pointer *this_12;
  const_iterator cVar14;
  Type *pTVar15;
  undefined4 extraout_var;
  Image *this_13;
  mapped_type *ppTVar16;
  mapped_type *pmVar17;
  Array *this_14;
  undefined **ppuVar18;
  undefined *puVar19;
  uint *puVar20;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var21;
  uint uVar22;
  Op OVar23;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__k;
  TypeManager *this_15;
  MessageConsumer *consumer;
  char *message;
  uint uVar24;
  pointer ppIVar25;
  bool bVar26;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar27;
  AccessQualifier qualifier;
  Type *type;
  bool has_spec_id;
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  pointer local_a0;
  uint32_t return_type_id;
  undefined4 uStack_94;
  Type *local_90;
  uint32_t local_84;
  uint32_t local_80;
  Dim local_7c;
  Type *local_78;
  string local_70;
  _Any_data local_50;
  __node_base_ptr local_40;
  code *local_38;
  
  OVar23 = inst->opcode_;
  iVar8 = spvOpcodeGeneratesType(OVar23);
  if ((OVar23 != OpTypeForwardPointer) && (iVar8 == 0)) {
    return (Type *)0x0;
  }
  type = (Type *)0x0;
  OVar23 = inst->opcode_;
  if (0x141 < (int)OVar23) {
    if ((int)OVar23 < 0x14a1) {
      if ((int)OVar23 < 0x1168) {
        if (OVar23 == OpTypePipeStorage) {
          type = (Type *)operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kPipeStorage;
          ppuVar18 = &PTR__Type_00b04e60;
        }
        else {
          if (OVar23 != OpTypeNamedBarrier) goto switchD_00506d05_default;
          type = (Type *)operator_new(0x28);
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (type->decorations_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          type->kind_ = kNamedBarrier;
          ppuVar18 = &PTR__Type_00b050c0;
        }
      }
      else {
        if (OVar23 == OpTypeCooperativeMatrixKHR) {
          this_09 = (CooperativeMatrixKHR *)operator_new(0x40);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          local_90 = GetType(this,uVar11);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          use = Instruction::GetSingleWordOperand(inst,uVar24 | 4);
          CooperativeMatrixKHR::CooperativeMatrixKHR(this_09,local_90,uVar11,uVar9,uVar10,use);
          type = (Type *)this_09;
          goto LAB_00507eb3;
        }
        if (OVar23 != OpTypeRayQueryKHR) {
          if (OVar23 != OpTypeNodePayloadArrayAMDX) goto switchD_00506d05_default;
          this_01 = (NodePayloadArrayAMDX *)operator_new(0x30);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          pTVar13 = GetType(this,uVar11);
          NodePayloadArrayAMDX::NodePayloadArrayAMDX(this_01,pTVar13);
          goto LAB_00507bd0;
        }
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kRayQueryKHR;
        ppuVar18 = &PTR__Type_00b05580;
      }
    }
    else {
      if (0x14ed < (int)OVar23) {
        if (OVar23 == OpTypeCooperativeMatrixNV) {
          this_10 = (CooperativeMatrixNV *)operator_new(0x40);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          pTVar13 = GetType(this,uVar11);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
          CooperativeMatrixNV::CooperativeMatrixNV(this_10,pTVar13,uVar11,uVar9,uVar10);
          type = (Type *)this_10;
        }
        else if (OVar23 == OpTypeTensorLayoutNV) {
          this_08 = (TensorLayoutNV *)operator_new(0x30);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          TensorLayoutNV::TensorLayoutNV(this_08,uVar11,uVar9);
          type = (Type *)this_08;
        }
        else {
          if (OVar23 != OpTypeTensorViewNV) goto switchD_00506d05_default;
          uVar24 = (int)((ulong)((long)(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
          ;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (2 < uVar24) {
            uVar11 = 2;
            do {
              uVar9 = Instruction::GetSingleWordOperand(inst,uVar11);
              extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(extra_words.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar9);
              if (decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations,
                           (iterator)
                           decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(uint *)&extra_words);
              }
              else {
                *(uint32_t *)
                 decorations.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = uVar9;
                decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4);
              }
              uVar11 = uVar11 + 1;
            } while (uVar24 != uVar11);
          }
          this_02 = (TensorViewNV *)operator_new(0x48);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          TensorViewNV::TensorViewNV
                    (this_02,uVar11,uVar9,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decorations);
          type = (Type *)this_02;
          if (decorations.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)decorations.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)decorations.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        goto LAB_00507eb3;
      }
      if (OVar23 == OpTypeHitObjectNV) {
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kHitObjectNV;
        ppuVar18 = &PTR__Type_00b057e0;
      }
      else {
        if (OVar23 == OpTypeCooperativeVectorNV) {
          this_07 = (CooperativeVectorNV *)operator_new(0x38);
          uVar11 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar11 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
          pTVar13 = GetType(this,uVar11);
          uVar24 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar24 = (uint)inst->has_result_id_;
          }
          uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
          CooperativeVectorNV::CooperativeVectorNV(this_07,pTVar13,uVar11);
          type = (Type *)this_07;
          goto LAB_00507eb3;
        }
        if (OVar23 != OpTypeAccelerationStructureKHR) goto switchD_00506d05_default;
        type = (Type *)operator_new(0x28);
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (type->decorations_).
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type->kind_ = kAccelerationStructureNV;
        ppuVar18 = &PTR__Type_00b05320;
      }
    }
    goto LAB_00507b86;
  }
  switch(OVar23) {
  case OpTypeVoid:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    ppuVar18 = &PTR__Type_00b03dc0;
    goto LAB_00507b86;
  case OpTypeBool:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kBool;
    ppuVar18 = &PTR__Type_00b04020;
    goto LAB_00507b86;
  case OpTypeInt:
    pTVar13 = (Type *)operator_new(0x30);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kInteger;
    pTVar13->_vptr_Type = (_func_int **)&PTR__Type_00b07a40;
    *(uint32_t *)&pTVar13->field_0x24 = uVar11;
    *(bool *)&pTVar13[1]._vptr_Type = uVar9 != 0;
    type = pTVar13;
    break;
  case OpTypeFloat:
    pTVar13 = (Type *)operator_new(0x28);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kFloat;
    puVar19 = &Float::vtable;
    goto LAB_00507d25;
  case OpTypeVector:
    this_05 = (Vector *)operator_new(0x38);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    pTVar13 = GetType(this,uVar11);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    Vector::Vector(this_05,pTVar13,uVar11);
    type = (Type *)this_05;
    break;
  case OpTypeMatrix:
    this_11 = (Matrix *)operator_new(0x38);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    pTVar13 = GetType(this,uVar11);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    Matrix::Matrix(this_11,pTVar13,uVar11);
    type = (Type *)this_11;
    break;
  case OpTypeImage:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    if ((int)((ulong)((long)(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar24 <
        8) {
      local_90 = (Type *)0x0;
    }
    else {
      uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 7);
      local_90 = (Type *)CONCAT44(extraout_var,uVar11);
      uVar24 = (inst->has_result_id_ & 1) + 1;
      if ((inst->has_type_id_ & 1U) == 0) {
        uVar24 = (uint)inst->has_result_id_;
      }
    }
    this_13 = (Image *)operator_new(0x48);
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24);
    local_78 = GetType(this,uVar11);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    local_7c = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    local_80 = Instruction::GetSingleWordOperand(inst,uVar24 + 2);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 3);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 | 4);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    Instruction::GetSingleWordOperand(inst,uVar24 + 5);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    qualifier = 0x507e58;
    uVar10 = Instruction::GetSingleWordOperand(inst,uVar24 + 6);
    Image::Image(this_13,local_78,local_7c,local_80,uVar11 == 1,uVar9 == 1,uVar10,
                 (ImageFormat)local_90,qualifier);
    type = (Type *)this_13;
    break;
  case OpTypeSampler:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kSampler;
    ppuVar18 = &PTR__Type_00b04280;
    goto LAB_00507b86;
  case OpTypeSampledImage:
    pTVar13 = (Type *)operator_new(0x30);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    pTVar15 = GetType(this,uVar11);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kSampledImage;
    pTVar13->_vptr_Type = (_func_int **)&PTR__Type_00b07f00;
    pTVar13[1]._vptr_Type = (_func_int **)pTVar15;
    type = pTVar13;
    break;
  case OpTypeArray:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    return_type_id = uVar11;
    ppIVar12 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_constant_inst_,&return_type_id);
    pIVar2 = *ppIVar12;
    if (pIVar2 == (mapped_type)0x0) {
      __assert_fail("length_constant_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x33a,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 2;
    id = 0;
    has_spec_id = false;
    OVar23 = pIVar2->opcode_;
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (OVar23 == OpSpecConstant) {
      pIVar3 = this->context_;
      if ((pIVar3->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar3);
      }
      local_50._M_unused._M_object = &id;
      local_50._8_8_ = &has_spec_id;
      local_38 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
                 ::_M_invoke;
      local_40 = (__node_base_ptr)
                 std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp:839:13)>
                 ::_M_manager;
      DecorationManager::ForEachDecoration
                ((pIVar3->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,return_type_id,1,
                 (function<void_(const_spvtools::opt::Instruction_&)> *)&local_50);
      if (local_40 != (__node_base_ptr)0x0) {
        (*(code *)local_40)(&local_50,&local_50,3);
      }
      OVar23 = pIVar2->opcode_;
      if ((has_spec_id & 1U) != 0) {
        if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                     (iterator)
                     extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&id);
        }
        else {
          *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = id;
          extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    if ((OVar23 == OpSpecConstant) || (OVar23 == OpConstant)) {
      pOVar5 = (pIVar2->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pIVar2->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                 -0x5555555555555555) < 3) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a5,"const Operand &spvtools::opt::Instruction::GetOperand(uint32_t) const"
                     );
      }
      _Var6._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = pOVar5[2].words.large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t;
      _Var21._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )&pOVar5[2].words.small_data_;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )_Var6._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        _Var21._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = _Var6._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      }
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )_Var6._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        puVar20 = pOVar5[2].words.small_data_ + pOVar5[2].words.size_;
      }
      else {
        puVar20 = *(uint **)((long)_Var6._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl + 8);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                 extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 *(undefined8 *)
                  _Var21._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl,puVar20);
      *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = (uint)has_spec_id;
    }
    else {
      if (*extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != 2) {
        __assert_fail("extra_words[0] == Array::LengthInfo::kDefiningId",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                      ,0x35c,
                      "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                     );
      }
      if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&extra_words,
                   (iterator)
                   extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&return_type_id);
      }
      else {
        *extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = return_type_id;
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if ((ulong)((long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 5) {
      __assert_fail("extra_words.size() >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x35f,
                    "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                   );
    }
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,return_type_id);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,&extra_words);
    this_14 = (Array *)operator_new(0x50);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    pTVar13 = GetType(this,uVar11);
    Array::Array(this_14,pTVar13,(LengthInfo *)&decorations);
    pTVar13 = (Type *)&this->id_to_incomplete_type_;
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    type = (Type *)this_14;
    local_84 = Instruction::GetSingleWordOperand(inst,uVar11);
    cVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)pTVar13,&local_84);
    if (cVar14.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
        ._M_cur != (__node_type *)0x0) {
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_84 = uVar11;
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,&local_84,&type);
      pTVar15 = type;
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_84 = uVar11;
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)pTVar13,&local_84);
      *ppTVar16 = pTVar15;
      pTVar13 = type;
    }
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      (long)local_a0 -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)extra_words.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)extra_words.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (cVar14.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
        ._M_cur != (__node_type *)0x0) {
      return pTVar13;
    }
    break;
  case OpTypeRuntimeArray:
    this_01 = (NodePayloadArrayAMDX *)operator_new(0x30);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    pTVar13 = GetType(this,uVar11);
    RuntimeArray::RuntimeArray((RuntimeArray *)this_01,pTVar13);
LAB_00507bd0:
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    type = &this_01->super_Type;
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
    cVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->id_to_incomplete_type_)._M_h,(key_type_conflict *)&decorations);
    if (cVar14.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
        ._M_cur != (__node_type *)0x0) {
      uVar9 = 0;
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&decorations,&type);
      pTVar13 = type;
      if (inst->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      __k = &decorations;
LAB_00507c65:
      *(uint32_t *)
       &(__k->
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        )._M_impl.super__Vector_impl_data._M_start = uVar9;
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)__k);
      *ppTVar16 = pTVar13;
      return type;
    }
    break;
  case OpTypeStruct:
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    pTVar13 = (Type *)0x0;
    bVar26 = false;
    if (uVar24 != (int)((ulong)((long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    {
      bVar26 = false;
      do {
        uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + (int)pTVar13);
        return_type_id = uVar11;
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)GetType(this,uVar11);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&decorations,(Type **)&extra_words);
        cVar14 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->id_to_incomplete_type_)._M_h,&return_type_id);
        bVar26 = (bool)(bVar26 | cVar14.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                                 ._M_cur != (__node_type *)0x0);
        uVar22 = (int)pTVar13 + 1;
        pTVar13 = (Type *)(ulong)uVar22;
        uVar24 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar24 = (uint)inst->has_result_id_;
        }
      } while (uVar22 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar24);
    }
    this_04 = (Struct *)operator_new(0x70);
    Struct::Struct(this_04,(vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            *)&decorations);
    type = (Type *)this_04;
    if (bVar26) {
      uVar9 = 0;
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar11);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar13 = type;
      if (inst->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar9);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_incomplete_type_,(key_type *)&extra_words);
      *ppTVar16 = pTVar13;
      pTVar13 = type;
    }
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar26) {
      return pTVar13;
    }
    break;
  case OpTypeOpaque:
    pTVar13 = (Type *)operator_new(0x48);
    this_06 = Instruction::GetInOperand(inst,0);
    Operand::AsString_abi_cxx11_(&local_70,this_06);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kOpaque;
    pTVar13->_vptr_Type = (_func_int **)&PTR__Opaque_00b08160;
    ppvVar1 = &pTVar13[1].decorations_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pTVar13[1]._vptr_Type = (_func_int **)ppvVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      *ppvVar1 = (pointer)CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]);
      pTVar13[1].decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_70.field_2._8_8_;
    }
    else {
      pTVar13[1]._vptr_Type = (_func_int **)local_70._M_dataplus._M_p;
      pTVar13[1].decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]);
    }
    pTVar13[1].decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    type = pTVar13;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    break;
  case OpTypePointer:
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
    this_12 = (Pointer *)operator_new(0x38);
    pTVar13 = GetType(this,uVar11);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    sc = Instruction::GetSingleWordOperand(inst,uVar11);
    Pointer::Pointer(this_12,pTVar13,sc);
    type = (Type *)this_12;
    cVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->id_to_incomplete_type_)._M_h,(key_type_conflict *)&decorations);
    if (cVar14.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar11);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->id_to_incomplete_type_)._M_h);
      break;
    }
    uVar9 = 0;
    uVar11 = 0;
    if (inst->has_result_id_ == true) {
      uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(extra_words.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,uVar11);
    std::
    vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
    ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
              ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                *)&this->incomplete_types_,(uint *)&extra_words,&type);
    pTVar13 = type;
    if (inst->has_result_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    __k = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
          &extra_words;
    goto LAB_00507c65;
  case OpTypeFunction:
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    return_type_id = uVar11;
    this_00 = &this->id_to_incomplete_type_;
    cVar14 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&return_type_id);
    bVar26 = cVar14.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
             ._M_cur != (__node_type *)0x0;
    local_90 = GetType(this,return_type_id);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    if (1 < (int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
            uVar24) {
      uVar22 = 1;
      do {
        id = Instruction::GetSingleWordOperand(inst,uVar24 + uVar22);
        extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)GetType(this,id);
        std::
        vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
        ::emplace_back<spvtools::opt::analysis::Type_const*>
                  ((vector<spvtools::opt::analysis::Type_const*,std::allocator<spvtools::opt::analysis::Type_const*>>
                    *)&decorations,(Type **)&extra_words);
        cVar14 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&id);
        bVar26 = (bool)(bVar26 | cVar14.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                                 ._M_cur != (__node_type *)0x0);
        uVar22 = uVar22 + 1;
        uVar24 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar24 = (uint)inst->has_result_id_;
        }
      } while (uVar22 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar24);
    }
    this_03 = (Function *)operator_new(0x48);
    analysis::Function::Function
              (this_03,local_90,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&decorations);
    type = (Type *)this_03;
    if (bVar26) {
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar11);
      std::
      vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
      ::emplace_back<unsigned_int,spvtools::opt::analysis::Type*&>
                ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                  *)&this->incomplete_types_,(uint *)&extra_words,&type);
      pTVar13 = type;
      uVar11 = 0;
      if (inst->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,uVar11);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&extra_words);
      *ppTVar16 = pTVar13;
    }
    pTVar13 = type;
    if (decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)decorations.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar26) {
      return pTVar13;
    }
    break;
  case OpTypeEvent:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kEvent;
    ppuVar18 = &PTR__Type_00b044e0;
    goto LAB_00507b86;
  case OpTypeDeviceEvent:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kDeviceEvent;
    ppuVar18 = &PTR__Type_00b04740;
    goto LAB_00507b86;
  case OpTypeReserveId:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kReserveId;
    ppuVar18 = &PTR__Type_00b049a0;
    goto LAB_00507b86;
  case OpTypeQueue:
    type = (Type *)operator_new(0x28);
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (type->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type->kind_ = kQueue;
    ppuVar18 = &PTR__Type_00b04c00;
LAB_00507b86:
    type->_vptr_Type = (_func_int **)ppuVar18;
    break;
  case OpTypePipe:
    pTVar13 = (Type *)operator_new(0x28);
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kPipe;
    puVar19 = &Pipe::vtable;
LAB_00507d25:
    pTVar13->_vptr_Type = (_func_int **)(puVar19 + 0x10);
    *(uint32_t *)&pTVar13->field_0x24 = uVar11;
    type = pTVar13;
    break;
  case OpTypeForwardPointer:
    uVar11 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar11 = (uint)inst->has_result_id_;
    }
    uVar11 = Instruction::GetSingleWordOperand(inst,uVar11);
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar11);
    pTVar13 = (Type *)operator_new(0x38);
    uVar24 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar24 = (uint)inst->has_result_id_;
    }
    uVar9 = Instruction::GetSingleWordOperand(inst,uVar24 + 1);
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->decorations_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar13->kind_ = kForwardPointer;
    pTVar13->_vptr_Type = (_func_int **)&PTR__Type_00b08620;
    *(uint32_t *)&pTVar13->field_0x24 = uVar11;
    *(uint32_t *)&pTVar13[1]._vptr_Type = uVar9;
    pTVar13[1].decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    type = pTVar13;
    std::
    vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
    ::emplace_back<unsigned_int&,spvtools::opt::analysis::Type*&>
              ((vector<spvtools::opt::analysis::TypeManager::UnresolvedType,std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>>
                *)&this->incomplete_types_,(uint *)&decorations,&type);
    pTVar13 = type;
    ppTVar16 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->id_to_incomplete_type_,(key_type *)&decorations);
    *ppTVar16 = pTVar13;
    return type;
  default:
switchD_00506d05_default:
    __assert_fail("false && \"Type not handled by the type manager.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x3fc,
                  "Type *spvtools::opt::analysis::TypeManager::RecordIfTypeDefinition(const Instruction &)"
                 );
  }
LAB_00507eb3:
  if ((inst->has_result_id_ == true) &&
     (uVar11 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_), id = uVar11,
     uVar11 != 0)) {
    if (type != (Type *)0x0) {
      pIVar3 = this->context_;
      if ((pIVar3->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar3);
      }
      this_15 = (TypeManager *)&decorations;
      DecorationManager::GetDecorationsFor
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this_15,
                 (pIVar3->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,uVar11,true);
      ppIVar7 = decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar25 = decorations.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar25 != ppIVar7;
          ppIVar25 = ppIVar25 + 1) {
        AttachDecoration(this_15,*ppIVar25,type);
      }
      _return_type_id = (_Hash_node_base *)type;
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&this->type_pool_;
      pVar27 = std::
               _Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,true>>>>
                         ((_Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)extra_words.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,&return_type_id,&extra_words);
      pTVar4 = *(mapped_type *)
                ((long)pVar27.first.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                + 8);
      ppTVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_type_,&id);
      uVar11 = id;
      *ppTVar16 = pTVar4;
      extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)pVar27.first.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
            + 8);
      pmVar17 = std::__detail::
                _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->type_to_id_,(key_type *)&extra_words);
      pTVar13 = type;
      *pmVar17 = uVar11;
      if ((Type *)_return_type_id != (Type *)0x0) {
        (*(code *)_return_type_id->_M_nxt[1]._M_nxt)();
      }
      if (decorations.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(decorations.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)decorations.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)decorations.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar13;
    }
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x403;
    message = "assertion failed: type should not be nullptr at this point";
  }
  else {
    consumer = this->consumer_;
    decorations.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x401;
    message = "assertion failed: instruction without result id found";
  }
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decorations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Log(consumer,SPV_MSG_INTERNAL_ERROR,
      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
      ,(spv_position_t *)&decorations,message);
  exit(1);
}

Assistant:

Type* TypeManager::RecordIfTypeDefinition(const Instruction& inst) {
  if (!IsTypeInst(inst.opcode())) return nullptr;

  Type* type = nullptr;
  switch (inst.opcode()) {
    case spv::Op::OpTypeVoid:
      type = new Void();
      break;
    case spv::Op::OpTypeBool:
      type = new Bool();
      break;
    case spv::Op::OpTypeInt:
      type = new Integer(inst.GetSingleWordInOperand(0),
                         inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeFloat:
      type = new Float(inst.GetSingleWordInOperand(0));
      break;
    case spv::Op::OpTypeVector:
      type = new Vector(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeMatrix:
      type = new Matrix(GetType(inst.GetSingleWordInOperand(0)),
                        inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeImage: {
      const spv::AccessQualifier access =
          inst.NumInOperands() < 8 ? spv::AccessQualifier::ReadOnly
                                   : static_cast<spv::AccessQualifier>(
                                         inst.GetSingleWordInOperand(7));
      type = new Image(
          GetType(inst.GetSingleWordInOperand(0)),
          static_cast<spv::Dim>(inst.GetSingleWordInOperand(1)),
          inst.GetSingleWordInOperand(2), inst.GetSingleWordInOperand(3) == 1,
          inst.GetSingleWordInOperand(4) == 1, inst.GetSingleWordInOperand(5),
          static_cast<spv::ImageFormat>(inst.GetSingleWordInOperand(6)),
          access);
    } break;
    case spv::Op::OpTypeSampler:
      type = new Sampler();
      break;
    case spv::Op::OpTypeSampledImage:
      type = new SampledImage(GetType(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeArray: {
      const uint32_t length_id = inst.GetSingleWordInOperand(1);
      const Instruction* length_constant_inst = id_to_constant_inst_[length_id];
      assert(length_constant_inst);

      // How will we distinguish one length value from another?
      // Determine extra words required to distinguish this array length
      // from another.
      std::vector<uint32_t> extra_words{Array::LengthInfo::kDefiningId};
      // If it is a specialised constant, retrieve its SpecId.
      // Only OpSpecConstant has a SpecId.
      uint32_t spec_id = 0u;
      bool has_spec_id = false;
      if (length_constant_inst->opcode() == spv::Op::OpSpecConstant) {
        context()->get_decoration_mgr()->ForEachDecoration(
            length_id, uint32_t(spv::Decoration::SpecId),
            [&spec_id, &has_spec_id](const Instruction& decoration) {
              assert(decoration.opcode() == spv::Op::OpDecorate);
              spec_id = decoration.GetSingleWordOperand(2u);
              has_spec_id = true;
            });
      }
      const auto opcode = length_constant_inst->opcode();
      if (has_spec_id) {
        extra_words.push_back(spec_id);
      }
      if ((opcode == spv::Op::OpConstant) ||
          (opcode == spv::Op::OpSpecConstant)) {
        // Always include the literal constant words.  In the spec constant
        // case, the constant might not be overridden, so it's still
        // significant.
        extra_words.insert(extra_words.end(),
                           length_constant_inst->GetOperand(2).words.begin(),
                           length_constant_inst->GetOperand(2).words.end());
        extra_words[0] = has_spec_id ? Array::LengthInfo::kConstantWithSpecId
                                     : Array::LengthInfo::kConstant;
      } else {
        assert(extra_words[0] == Array::LengthInfo::kDefiningId);
        extra_words.push_back(length_id);
      }
      assert(extra_words.size() >= 2);
      Array::LengthInfo length_info{length_id, extra_words};

      type = new Array(GetType(inst.GetSingleWordInOperand(0)), length_info);

      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeRuntimeArray:
      type = new RuntimeArray(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeNodePayloadArrayAMDX:
      type = new NodePayloadArrayAMDX(GetType(inst.GetSingleWordInOperand(0)));
      if (id_to_incomplete_type_.count(inst.GetSingleWordInOperand(0))) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      break;
    case spv::Op::OpTypeStruct: {
      std::vector<const Type*> element_types;
      bool incomplete_type = false;
      for (uint32_t i = 0; i < inst.NumInOperands(); ++i) {
        uint32_t type_id = inst.GetSingleWordInOperand(i);
        element_types.push_back(GetType(type_id));
        if (id_to_incomplete_type_.count(type_id)) {
          incomplete_type = true;
        }
      }
      type = new Struct(element_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeOpaque: {
      type = new Opaque(inst.GetInOperand(0).AsString());
    } break;
    case spv::Op::OpTypePointer: {
      uint32_t pointee_type_id = inst.GetSingleWordInOperand(1);
      type = new Pointer(
          GetType(pointee_type_id),
          static_cast<spv::StorageClass>(inst.GetSingleWordInOperand(0)));

      if (id_to_incomplete_type_.count(pointee_type_id)) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
      id_to_incomplete_type_.erase(inst.result_id());

    } break;
    case spv::Op::OpTypeFunction: {
      bool incomplete_type = false;
      uint32_t return_type_id = inst.GetSingleWordInOperand(0);
      if (id_to_incomplete_type_.count(return_type_id)) {
        incomplete_type = true;
      }
      Type* return_type = GetType(return_type_id);
      std::vector<const Type*> param_types;
      for (uint32_t i = 1; i < inst.NumInOperands(); ++i) {
        uint32_t param_type_id = inst.GetSingleWordInOperand(i);
        param_types.push_back(GetType(param_type_id));
        if (id_to_incomplete_type_.count(param_type_id)) {
          incomplete_type = true;
        }
      }

      type = new Function(return_type, param_types);

      if (incomplete_type) {
        incomplete_types_.emplace_back(inst.result_id(), type);
        id_to_incomplete_type_[inst.result_id()] = type;
        return type;
      }
    } break;
    case spv::Op::OpTypeEvent:
      type = new Event();
      break;
    case spv::Op::OpTypeDeviceEvent:
      type = new DeviceEvent();
      break;
    case spv::Op::OpTypeReserveId:
      type = new ReserveId();
      break;
    case spv::Op::OpTypeQueue:
      type = new Queue();
      break;
    case spv::Op::OpTypePipe:
      type = new Pipe(
          static_cast<spv::AccessQualifier>(inst.GetSingleWordInOperand(0)));
      break;
    case spv::Op::OpTypeForwardPointer: {
      // Handling of forward pointers is different from the other types.
      uint32_t target_id = inst.GetSingleWordInOperand(0);
      type = new ForwardPointer(target_id, static_cast<spv::StorageClass>(
                                               inst.GetSingleWordInOperand(1)));
      incomplete_types_.emplace_back(target_id, type);
      id_to_incomplete_type_[target_id] = type;
      return type;
    }
    case spv::Op::OpTypePipeStorage:
      type = new PipeStorage();
      break;
    case spv::Op::OpTypeNamedBarrier:
      type = new NamedBarrier();
      break;
    case spv::Op::OpTypeAccelerationStructureNV:
      type = new AccelerationStructureNV();
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
      type = new CooperativeMatrixNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1),
                                     inst.GetSingleWordInOperand(2),
                                     inst.GetSingleWordInOperand(3));
      break;
    case spv::Op::OpTypeCooperativeMatrixKHR:
      type = new CooperativeMatrixKHR(
          GetType(inst.GetSingleWordInOperand(0)),
          inst.GetSingleWordInOperand(1), inst.GetSingleWordInOperand(2),
          inst.GetSingleWordInOperand(3), inst.GetSingleWordInOperand(4));
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      type = new CooperativeVectorNV(GetType(inst.GetSingleWordInOperand(0)),
                                     inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeRayQueryKHR:
      type = new RayQueryKHR();
      break;
    case spv::Op::OpTypeHitObjectNV:
      type = new HitObjectNV();
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      type = new TensorLayoutNV(inst.GetSingleWordInOperand(0),
                                inst.GetSingleWordInOperand(1));
      break;
    case spv::Op::OpTypeTensorViewNV: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> perm;
      for (uint32_t i = 2; i < count; ++i) {
        perm.push_back(inst.GetSingleWordOperand(i));
      }
      type = new TensorViewNV(inst.GetSingleWordInOperand(0),
                              inst.GetSingleWordInOperand(1), perm);
      break;
    }
    default:
      assert(false && "Type not handled by the type manager.");
      break;
  }

  uint32_t id = inst.result_id();
  SPIRV_ASSERT(consumer_, id != 0, "instruction without result id found");
  SPIRV_ASSERT(consumer_, type != nullptr,
               "type should not be nullptr at this point");
  std::vector<Instruction*> decorations =
      context()->get_decoration_mgr()->GetDecorationsFor(id, true);
  for (auto dec : decorations) {
    AttachDecoration(*dec, type);
  }
  std::unique_ptr<Type> unique(type);
  auto pair = type_pool_.insert(std::move(unique));
  id_to_type_[id] = pair.first->get();
  type_to_id_[pair.first->get()] = id;
  return type;
}